

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O3

char * __thiscall
fmt::v10::formatter<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_char,_void>::
parse(formatter<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_char,_void> *this,
     format_parse_context *ctx)

{
  char *begin;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  format_error *this_00;
  size_t sVar4;
  char *pcVar5;
  char *end;
  
  end = (ctx->format_str_).data_;
  sVar4 = (ctx->format_str_).size_;
  pcVar2 = end + sVar4;
  iVar3 = 4;
  if ((sVar4 != 0) && (*end == '.')) {
    begin = end + 1;
    pcVar5 = end;
    do {
      sVar4 = sVar4 - 1;
      end = pcVar5 + 1;
      if (sVar4 == 0) break;
      pcVar1 = pcVar5 + 1;
      pcVar5 = end;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
    iVar3 = parse_unsigned_int(this,begin,end);
  }
  this->precision = iVar3;
  if ((end != pcVar2) && (*end != '}')) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::runtime_error(this_00,"invalid format");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return end;
}

Assistant:

constexpr auto parse(const format_parse_context& ctx) {
    const auto* it = ctx.begin();
    const auto* end = ctx.end();

    if (it != end && *it == '.') {
      // Support precision:
      ++it;
      auto start = it;
      while (is_digit(*it) && it != end) {
        ++it;
      }
      precision = parse_unsigned_int(start, it);
    } else {
      precision = 4;
    }

    if (it != end && *it != '}') {
      throw format_error("invalid format");
    }

    return it;
  }